

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
::has_element(raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  __m128i match;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_38;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  
  probe(&local_38,this,hashval);
  auVar6 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar6 = pshuflw(auVar6,auVar6,0);
  while( true ) {
    pcVar1 = this->ctrl_ + local_38.offset_;
    cVar3 = pcVar1[0xf];
    cVar8 = auVar6[0];
    auVar9[0] = -(cVar8 == *pcVar1);
    cVar10 = auVar6[1];
    auVar9[1] = -(cVar10 == pcVar1[1]);
    cVar11 = auVar6[2];
    auVar9[2] = -(cVar11 == pcVar1[2]);
    cVar12 = auVar6[3];
    auVar9[3] = -(cVar12 == pcVar1[3]);
    auVar9[4] = -(cVar8 == pcVar1[4]);
    auVar9[5] = -(cVar10 == pcVar1[5]);
    auVar9[6] = -(cVar11 == pcVar1[6]);
    auVar9[7] = -(cVar12 == pcVar1[7]);
    auVar9[8] = -(cVar8 == pcVar1[8]);
    auVar9[9] = -(cVar10 == pcVar1[9]);
    auVar9[10] = -(cVar11 == pcVar1[10]);
    auVar9[0xb] = -(cVar12 == pcVar1[0xb]);
    auVar9[0xc] = -(cVar8 == pcVar1[0xc]);
    auVar9[0xd] = -(cVar10 == pcVar1[0xd]);
    auVar9[0xe] = -(cVar11 == pcVar1[0xe]);
    auVar9[0xf] = -(cVar12 == cVar3);
    for (uVar5 = (uint)(ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar9[0xf] >> 7) << 0xf); uVar5 != 0;
        uVar5 = uVar5 - 1 & uVar5) {
      uVar2 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (this->slots_[uVar2 + local_38.offset_ & local_38.mask_] == *elem) goto LAB_0010c1c2;
    }
    auVar7[0] = -(*pcVar1 == -0x80);
    auVar7[1] = -(pcVar1[1] == -0x80);
    auVar7[2] = -(pcVar1[2] == -0x80);
    auVar7[3] = -(pcVar1[3] == -0x80);
    auVar7[4] = -(pcVar1[4] == -0x80);
    auVar7[5] = -(pcVar1[5] == -0x80);
    auVar7[6] = -(pcVar1[6] == -0x80);
    auVar7[7] = -(pcVar1[7] == -0x80);
    auVar7[8] = -(pcVar1[8] == -0x80);
    auVar7[9] = -(pcVar1[9] == -0x80);
    auVar7[10] = -(pcVar1[10] == -0x80);
    auVar7[0xb] = -(pcVar1[0xb] == -0x80);
    auVar7[0xc] = -(pcVar1[0xc] == -0x80);
    auVar7[0xd] = -(pcVar1[0xd] == -0x80);
    auVar7[0xe] = -(pcVar1[0xe] == -0x80);
    auVar7[0xf] = -(cVar3 == -0x80);
    if ((((((((((((((((auVar7 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar7 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar7 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar7 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar7 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar7 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar7 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar7 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar7 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar7 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar7 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar7 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80) break;
    lVar4 = local_38.offset_ + local_38.index_;
    local_38.index_ = local_38.index_ + 0x10;
    local_38.offset_ = lVar4 + 0x10U & local_38.mask_;
    if (this->capacity_ <= local_38.index_) {
      __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x87c,
                    "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned int>, phmap::Hash<uint32_t>, phmap::EqualTo<unsigned int>, std::allocator<unsigned int>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashSetPolicy<unsigned int>, Hash = phmap::Hash<uint32_t>, Eq = phmap::EqualTo<unsigned int>, Alloc = std::allocator<unsigned int>]"
                   );
    }
  }
LAB_0010c1c2:
  return uVar5 != 0;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }